

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhaptic.c
# Opt level: O0

_Bool lhap_effect2lin(ff_effect *lin,ALLEGRO_HAPTIC_EFFECT *al)

{
  int type;
  _Bool _Var1;
  ALLEGRO_HAPTIC_PERIODIC_EFFECT *al_00;
  ff_periodic_effect *in_RSI;
  __u16 *in_RDI;
  double dVar2;
  ALLEGRO_HAPTIC_CONDITION_EFFECT *in_stack_ffffffffffffffd8;
  ff_replay *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  memset(in_RDI,0,0x30);
  type._0_2_ = in_RSI->waveform;
  type._2_2_ = in_RSI->period;
  _Var1 = lhap_type2lin(in_RDI,type);
  if (_Var1) {
    dVar2 = round((*(double *)&in_RSI->phase * 49152.0) / 6.283185307179586);
    in_RDI[2] = (__u16)(int)dVar2;
    in_RDI[1] = 0xffff;
    _Var1 = lhap_replay2lin(in_stack_ffffffffffffffe0,
                            (ALLEGRO_HAPTIC_REPLAY *)in_stack_ffffffffffffffd8);
    if (_Var1) {
      al_00 = (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)(ulong)(*in_RDI - 0x50);
      switch(al_00) {
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x0:
        local_1 = lhap_rumble2lin((ff_rumble_effect *)al_00,
                                  (ALLEGRO_HAPTIC_RUMBLE_EFFECT *)in_stack_ffffffffffffffd8);
        break;
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x1:
        local_1 = lhap_periodic2lin(in_RSI,al_00);
        break;
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x2:
        local_1 = lhap_constant2lin((ff_constant_effect *)al_00,
                                    (ALLEGRO_HAPTIC_CONSTANT_EFFECT *)in_stack_ffffffffffffffd8);
        break;
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x3:
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x4:
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x5:
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x6:
        local_1 = lhap_condition2lin((ff_condition_effect *)al_00,in_stack_ffffffffffffffd8);
        break;
      case (ALLEGRO_HAPTIC_PERIODIC_EFFECT *)0x7:
        local_1 = lhap_ramp2lin((ff_ramp_effect *)al_00,
                                (ALLEGRO_HAPTIC_RAMP_EFFECT *)in_stack_ffffffffffffffd8);
        break;
      default:
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool lhap_effect2lin(struct ff_effect *lin, ALLEGRO_HAPTIC_EFFECT *al)
{
   memset(lin, 0, sizeof(*lin));

   if (!lhap_type2lin(&lin->type, al->type))
      return false;
   /* lin_effect->replay = effect->re; */
   lin->direction = (__u16)
      round(((double)0xC000 * al->direction.angle) / (2 * M_PI));
   lin->id = -1;
   if (!lhap_replay2lin(&lin->replay, &al->replay))
      return false;
   switch (lin->type) {
      case FF_RUMBLE:
         return lhap_rumble2lin(&lin->u.rumble, &al->data.rumble);
      case FF_PERIODIC:
         return lhap_periodic2lin(&lin->u.periodic, &al->data.periodic);
      case FF_CONSTANT:
         return lhap_constant2lin(&lin->u.constant, &al->data.constant);
      case FF_RAMP:
         return lhap_ramp2lin(&lin->u.ramp, &al->data.ramp);
      case FF_SPRING:   /* fall through */
      case FF_FRICTION: /* fall through */
      case FF_DAMPER:   /* fall through */
      case FF_INERTIA:
         return lhap_condition2lin(&lin->u.condition[0], &al->data.condition);
      default:
         return false;
   }
}